

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O2

bool mkvmuxer::WriteEbmlHeader(IMkvWriter *writer,uint64_t doc_type_version,char *doc_type)

{
  bool bVar1;
  uint64 uVar2;
  uint64 uVar3;
  uint64 uVar4;
  uint64 uVar5;
  uint64 uVar6;
  uint64 uVar7;
  uint64 uVar8;
  
  uVar2 = EbmlElementSize(0x4286,1);
  uVar3 = EbmlElementSize(0x42f7,1);
  uVar4 = EbmlElementSize(0x42f2,4);
  uVar5 = EbmlElementSize(0x42f3,8);
  uVar6 = EbmlElementSize(0x4282,doc_type);
  uVar7 = EbmlElementSize(0x4287,doc_type_version);
  uVar8 = EbmlElementSize(0x4285,2);
  bVar1 = WriteEbmlMasterElement
                    (writer,0x1a45dfa3,uVar6 + uVar7 + uVar8 + uVar4 + uVar5 + uVar2 + uVar3);
  if (bVar1) {
    bVar1 = WriteEbmlElement(writer,0x4286,1);
    if (bVar1) {
      bVar1 = WriteEbmlElement(writer,0x42f7,1);
      if (bVar1) {
        bVar1 = WriteEbmlElement(writer,0x42f2,4);
        if (bVar1) {
          bVar1 = WriteEbmlElement(writer,0x42f3,8);
          if (bVar1) {
            bVar1 = WriteEbmlElement(writer,0x4282,doc_type);
            if (bVar1) {
              bVar1 = WriteEbmlElement(writer,0x4287,doc_type_version);
              if (bVar1) {
                bVar1 = WriteEbmlElement(writer,0x4285,2);
                return bVar1;
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool WriteEbmlHeader(IMkvWriter* writer, uint64_t doc_type_version,
                     const char* const doc_type) {
  // Level 0
  uint64_t size =
      EbmlElementSize(libwebm::kMkvEBMLVersion, static_cast<uint64>(1));
  size += EbmlElementSize(libwebm::kMkvEBMLReadVersion, static_cast<uint64>(1));
  size += EbmlElementSize(libwebm::kMkvEBMLMaxIDLength, static_cast<uint64>(4));
  size +=
      EbmlElementSize(libwebm::kMkvEBMLMaxSizeLength, static_cast<uint64>(8));
  size += EbmlElementSize(libwebm::kMkvDocType, doc_type);
  size += EbmlElementSize(libwebm::kMkvDocTypeVersion,
                          static_cast<uint64>(doc_type_version));
  size +=
      EbmlElementSize(libwebm::kMkvDocTypeReadVersion, static_cast<uint64>(2));

  if (!WriteEbmlMasterElement(writer, libwebm::kMkvEBML, size))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvEBMLVersion,
                        static_cast<uint64>(1))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvEBMLReadVersion,
                        static_cast<uint64>(1))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvEBMLMaxIDLength,
                        static_cast<uint64>(4))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvEBMLMaxSizeLength,
                        static_cast<uint64>(8))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvDocType, doc_type))
    return false;
  if (!WriteEbmlElement(writer, libwebm::kMkvDocTypeVersion,
                        static_cast<uint64>(doc_type_version))) {
    return false;
  }
  if (!WriteEbmlElement(writer, libwebm::kMkvDocTypeReadVersion,
                        static_cast<uint64>(2))) {
    return false;
  }

  return true;
}